

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,true,false,true>>>
::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,true,false,true>>>
          *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  uint dimension;
  ulong uVar1;
  ID_index local_24;
  
  local_24 = cellID;
  std::
  unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::try_emplace<unsigned_int&>
            ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)(this + 0x78),&local_24,(uint *)(this + 0x70));
  dimension = dim;
  if (dim == -1) {
    uVar1 = (long)(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar1 == 0) {
      dimension = 0;
    }
    else {
      dimension = (int)(uVar1 >> 2) - 1;
    }
  }
  Matrix_all_dimension_holder<int>::update_up((Matrix_all_dimension_holder<int> *)this,dimension);
  _reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (__return_storage_ptr__,this,local_24,boundary,dim);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::insert_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    if (pivotToColumnIndex_.size() <= cellID) {
      pivotToColumnIndex_.resize(cellID * 2 + 1, Master_matrix::template get_null_value<Index>());
    }
  }

  if constexpr (Master_matrix::Option_list::has_vine_update && Master_matrix::Option_list::has_column_pairings) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      Swap_opt::CP::pivotToPosition_.try_emplace(cellID, _nextPosition());
    } else {
      if (Swap_opt::CP::pivotToPosition_.size() <= cellID)
        Swap_opt::CP::pivotToPosition_.resize(pivotToColumnIndex_.size(),
                                              Master_matrix::template get_null_value<Pos_index>());
      Swap_opt::CP::pivotToPosition_[cellID] = _nextPosition();
    }
  }

  if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
    Dim_opt::update_up(dim == Master_matrix::template get_null_value<Dimension>()
                           ? (boundary.size() == 0 ? 0 : boundary.size() - 1)
                           : dim);
  }

  return _reduce_boundary(cellID, boundary, dim);
}